

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O1

err_t dstuSign(octet *sig,dstu_params *params,size_t ld,octet *hash,size_t hash_len,octet *privkey,
              gen_i rng,void *rng_state)

{
  u64 *puVar1;
  byte *pbVar2;
  u64 *dest;
  octet *dest_00;
  u64 *puVar3;
  err_t eVar4;
  bool_t bVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ulong count;
  octet *pos;
  ec_o *peVar9;
  u64 *dest_01;
  ec_o *local_90;
  octet *local_88;
  u64 *local_80;
  u64 *local_78;
  u64 *local_70;
  u64 *local_68;
  octet *local_60;
  u64 *local_58;
  size_t local_50;
  ulong local_48;
  octet *local_40;
  u64 *local_38;
  
  local_90 = (ec_o *)0x0;
  if (rng == (gen_i)0x0) {
    eVar4 = 0x130;
  }
  else {
    eVar4 = dstuEcCreate(&local_90,params,dstuSign_deep);
    peVar9 = local_90;
    if (eVar4 == 0) {
      local_88 = hash;
      local_60 = sig;
      sVar6 = wwBitSize(local_90->order,local_90->f->n);
      count = sVar6 + 7 >> 3;
      local_40 = privkey;
      bVar5 = memIsValid(privkey,count);
      eVar4 = 0x6d;
      if (count << 4 <= ld && ((ld & 0xf) == 0 && bVar5 != 0)) {
        bVar5 = memIsValid(local_88,hash_len);
        if (bVar5 != 0) {
          local_48 = ld >> 3;
          bVar5 = memIsValid(local_60,local_48);
          if (bVar5 != 0) {
            dest_01 = (u64 *)((long)&(peVar9->hdr).keep + (peVar9->hdr).keep);
            sVar7 = peVar9->f->n;
            uVar8 = peVar9->f->no;
            puVar1 = dest_01 + sVar7;
            local_58 = puVar1 + sVar7;
            local_38 = local_58 + sVar7;
            local_70 = local_38 + sVar7;
            local_68 = local_70 + sVar7;
            local_78 = local_68 + sVar7;
            local_80 = puVar1;
            local_50 = ld;
            if (hash_len < uVar8) {
              memCopy(puVar1,local_88,hash_len);
              memSet((void *)(hash_len + (long)puVar1),'\0',peVar9->f->no - hash_len);
            }
            else {
              memCopy(puVar1,local_88,uVar8);
              sVar7 = gf2Deg(peVar9->f);
              pbVar2 = (byte *)((long)puVar1 + (peVar9->f->no - 1));
              *pbVar2 = *pbVar2 & ~(-1 << ((byte)sVar7 & 7));
            }
            puVar1 = local_80;
            (*peVar9->f->from)(local_80,(octet *)local_80,peVar9->f,local_78);
            peVar9 = local_90;
            bVar5 = wwIsZero(puVar1,local_90->f->n);
            if (bVar5 != 0) {
              wwCopy(local_80,peVar9->f->unity,peVar9->f->n);
            }
            uVar8 = sVar6 + 0x3f >> 6;
            pos = (octet *)(sVar6 - 1);
            local_88 = pos;
            do {
              do {
                do {
                  do {
                    (*rng)(dest_01,count,rng_state);
                    u64From(dest_01,dest_01,count);
                    wwTrimHi(dest_01,uVar8,(size_t)pos);
                    bVar5 = wwIsZero(dest_01,uVar8);
                    puVar1 = local_58;
                  } while (bVar5 != 0);
                  bVar5 = ecMulA(local_58,local_90->base,local_90,dest_01,uVar8,local_78);
                  peVar9 = local_90;
                  if (bVar5 == 0) {
                    eVar4 = 0x1f6;
                    goto LAB_001417a4;
                  }
                  bVar5 = wwIsZero(puVar1,local_90->f->n);
                  puVar3 = local_38;
                  puVar1 = local_78;
                } while (bVar5 != 0);
                (*peVar9->f->mul)(local_38,local_58,local_80,peVar9->f,local_78);
                dest = local_70;
                pos = local_88;
                (*local_90->f->to)((octet *)local_70,puVar3,local_90->f,puVar1);
                u64From(dest,dest,count);
                wwTrimHi(dest,uVar8,(size_t)pos);
                bVar5 = wwIsZero(dest,uVar8);
                puVar1 = local_68;
              } while (bVar5 != 0);
              u64From(local_68,local_40,count);
              zzMulMod(puVar1,puVar1,local_70,local_90->order,uVar8,local_78);
              peVar9 = local_90;
              zzAddMod(puVar1,puVar1,dest_01,local_90->order,uVar8);
              bVar5 = wwIsZero(puVar1,uVar8);
              dest_00 = local_60;
            } while (bVar5 != 0);
            eVar4 = 0;
            memSet(local_60,'\0',local_48);
            u64To(dest_00,count,local_70);
            u64To(dest_00 + (local_50 >> 4),count,local_68);
          }
        }
      }
LAB_001417a4:
      blobClose(peVar9);
    }
  }
  return eVar4;
}

Assistant:

err_t dstuSign(octet sig[], const dstu_params* params, size_t ld, 
	const octet hash[], size_t hash_len, const octet privkey[], 
	gen_i rng, void* rng_state)
{
	err_t code;
	size_t order_n, order_no, order_nb;
	// состояние
	ec_o* ec = 0;
	word* e;		/* эфемерный лк */
	word* h;		/* хэш-значение как элемент поля */
	word* x;		/* х-координата эфемерного ок */
	word* y;		/* y-координата эфемерного ок */
	word* r;		/* первая часть ЭЦП */
	word* s;		/* вторая часть ЭЦП */
	void* stack;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// старт
	code = dstuEcCreate(&ec, params, dstuSign_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	order_nb = wwBitSize(ec->order, ec->f->n);
	order_no = O_OF_B(order_nb);
	order_n = W_OF_B(order_nb);
	// проверить входные указатели
	// шаги 1, 2: проверка params, privkey
	// шаг 3: проверить ld
	if (!memIsValid(privkey, order_no) || 
		ld % 16 != 0 || ld < 16 * order_no ||
		!memIsValid(hash, hash_len) ||
		!memIsValid(sig, O_OF_B(ld)))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	e = objEnd(ec, word);
	h = e + ec->f->n;
	x = h + ec->f->n;
	y = x + ec->f->n;
	r = y + ec->f->n;
	s = r + ec->f->n;
	stack = s + ec->f->n;
	// шаги 4 -- 6: хэширование
	// шаг 7: перевести hash в элемент основного поля h
	// [алгоритм из раздела 5.9 ДСТУ]
	if (hash_len < ec->f->no)
	{
		memCopy(h, hash, hash_len);
		memSetZero((octet*)h + hash_len, ec->f->no - hash_len);
	}
	else
	{
		memCopy(h, hash, ec->f->no);
		// memTrimHi(h, ec->f->no, gf2Deg(ec->f));
		((octet*)h)[ec->f->no - 1] &= (1 << gf2Deg(ec->f) % 8) - 1;
	}
	qrFrom(h, (octet*)h, ec->f, stack);
	// шаг 7: если h == 0, то h <- 1
	if (qrIsZero(h, ec->f))
		qrSetUnity(h, ec->f);
	// шаг 8: e <-R {1,2,..., order - 1}
	// [алгоритм из раздела 6.3 ДСТУ --- обрезка e]
step8:
	while (1)
	{
		rng(e, O_OF_B(order_nb), rng_state);
		wwFrom(e, e, O_OF_B(order_nb));
		wwTrimHi(e, order_n, order_nb - 1);
		ASSERT(wwCmp(e, ec->order, order_n) < 0);
		if (!wwIsZero(e, order_n))
			break;
	}
	// шаг 8: (x, y) <- e G
	if (!ecMulA(x, ec->base, ec, e, order_n, stack))
	{
		// если params корректны, то этого быть не должно
		dstuEcClose(ec);
		return ERR_BAD_PARAMS;
	}
	// шаг 8: если x == 0, то повторить генерацию
	if (qrIsZero(x, ec->f))
		goto step8;
	// шаг 9: y <- x * h
	qrMul(y, x, h, ec->f, stack);
	// шаг 10: r <- \bar{y}
	ASSERT(order_n <= ec->f->n);
	qrTo((octet*)r, y, ec->f, stack);
	wwFrom(r, r, order_no);
	wwTrimHi(r, order_n, order_nb - 1);
	// шаг 11: если r = 0, то повторить генерацию
	if (wwIsZero(r, order_n))
		goto step8;
	// шаг 12: s <- (e + dr) mod order
	wwFrom(s, privkey, order_no);
	zzMulMod(s, s, r, ec->order, order_n, stack);
	zzAddMod(s, s, e, ec->order, order_n);
	// шаг 13: если s = 0, то повторить генерацию
	if (wwIsZero(s, order_n))
		goto step8;
	// шаг 14: сформировать ЭЦП из r и s
	// [алгоритм из раздела 5.10 ДСТУ]
	memSetZero(sig, O_OF_B(ld));
	wwTo(sig, order_no, r);
	wwTo(sig + ld / 16, order_no, s);
	// все нормально
	dstuEcClose(ec);
	return code;
}